

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

bool __thiscall
dtc::text_input_buffer::consume_integer_expression
          (text_input_buffer *this,unsigned_long_long *outInt)

{
  int iVar1;
  element_type *peVar2;
  byte bVar3;
  bool bVar4;
  _Elt_pointer psVar5;
  undefined1 auVar6 [12];
  expression_ptr e;
  __buckets_ptr local_20;
  
  psVar5 = (this->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar5 == (this->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar3 = 0;
  }
  else {
    if (psVar5 == (this->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar5 = (this->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar5[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar1 = peVar2->cursor;
    bVar3 = 0;
    if ((-1 < (long)iVar1) && (iVar1 < peVar2->size)) {
      bVar3 = peVar2->buffer[iVar1];
    }
  }
  if (bVar3 - 0x30 < 10) {
    bVar4 = consume_integer(this,outInt);
    return bVar4;
  }
  if (bVar3 == 0x28) {
    parse_expression((text_input_buffer *)&stack0xffffffffffffffe0,SUB81(this,0));
    if (local_20 == (__buckets_ptr)0x0) {
      bVar3 = 0;
    }
    else {
      auVar6 = (*(code *)(*local_20)->_M_nxt)(local_20);
      bVar3 = auVar6[8];
      if ((auVar6 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
        *outInt = auVar6._0_8_;
        bVar3 = 1;
      }
    }
    if (local_20 != (__buckets_ptr)0x0) {
      (*(code *)(*local_20)[3]._M_nxt)(local_20);
    }
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool
text_input_buffer::consume_integer_expression(unsigned long long &outInt)
{
	switch (*(*this))
	{
		case '(':
		{
			expression_ptr e(parse_expression(true));
			if (!e)
			{
				return false;
			}
			auto r = (*e)();
			if (r.second)
			{
				outInt = r.first;
				return true;
			}
			return false;
		}
		case '0'...'9':
			return consume_integer(outInt);
		default:
			return false;
	}
}